

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void idx2::Dealloc<unsigned_long,idx2::chunk_exp_info>
               (hash_table<unsigned_long,_idx2::chunk_exp_info> *Ht)

{
  if (Ht->Alloc != (allocator *)0x0) {
    DeallocPtr<unsigned_long>(&Ht->Keys,Ht->Alloc);
    DeallocPtr<idx2::chunk_exp_info>(&Ht->Vals,Ht->Alloc);
    DeallocPtr<idx2::hash_table<unsigned_long,idx2::chunk_exp_info>::bucket_status>
              (&Ht->Stats,Ht->Alloc);
    Ht->Size = 0;
    Ht->LogCapacity = 0;
    Ht->Alloc = (allocator *)0x0;
  }
  return;
}

Assistant:

void
Dealloc(hash_table<k, v>* Ht)
{
  if (Ht->Alloc)
  {
    DeallocPtr(&Ht->Keys, Ht->Alloc);
    DeallocPtr(&Ht->Vals, Ht->Alloc);
    DeallocPtr(&Ht->Stats, Ht->Alloc);
    Ht->Size = Ht->LogCapacity = 0;
    Ht->Alloc = nullptr;
  }
}